

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

bool __thiscall
ON_Mesh::GetTightBoundingBox
          (ON_Mesh *this,ON_BoundingBox *Xtight_bbox,bool bGrowBox,
          ON_SimpleArray<ON_PlaneEquation> *Clip,ON_Xform *xform)

{
  ON_BoundingBoxCache *this_00;
  uint uVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  ON_3dPoint P_03;
  ON_3dPoint P_04;
  ON_3dPoint P_05;
  ON_3dPoint P_06;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  double *pdVar10;
  double *pdVar11;
  ulong *puVar12;
  ulong uVar13;
  uint7 extraout_var;
  uint7 extraout_var_00;
  undefined7 in_register_00000011;
  ulong uVar14;
  int i_1;
  uint n;
  ON_BoundingBox *pOVar15;
  size_type __n;
  int j_1;
  long lVar16;
  long lVar17;
  ON_MeshFace *pOVar18;
  uint i;
  ulong uVar19;
  long lVar20;
  ON_Xform *xform_00;
  long lVar21;
  bool bVar22;
  double dVar23;
  __type __x;
  double dVar24;
  reference rVar25;
  byte local_2cc;
  int local_2c4;
  uint LastData;
  uint NextData;
  ON_BoundingBox *local_2b8;
  undefined8 local_2b0;
  ON_3dPoint P;
  ulong local_278;
  ON_Interval Dom;
  ON_3dPoint Next;
  ON_Interval D;
  double local_208;
  ON_BoundingBox bbox;
  ON_3dPoint local_1c0;
  ON_3dPoint local_1a8;
  ON_SHA1_Hash hash;
  vector<bool,_std::allocator<bool>_> ClipData;
  ON_SHA1 sha1;
  
  if ((int)CONCAT71(in_register_00000011,bGrowBox) == 0) {
LAB_003fb761:
    dVar4 = ON_BoundingBox::EmptyBoundingBox.m_max.z;
    dVar3 = ON_BoundingBox::EmptyBoundingBox.m_max.x;
    dVar2 = ON_BoundingBox::EmptyBoundingBox.m_min.z;
    dVar24 = ON_BoundingBox::EmptyBoundingBox.m_min.y;
    dVar23 = ON_BoundingBox::EmptyBoundingBox.m_min.x;
    (Xtight_bbox->m_max).y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
    (Xtight_bbox->m_max).z = dVar4;
    (Xtight_bbox->m_min).z = dVar2;
    (Xtight_bbox->m_max).x = dVar3;
    (Xtight_bbox->m_min).x = dVar23;
    (Xtight_bbox->m_min).y = dVar24;
    local_2cc = 0;
  }
  else {
    bVar6 = ON_BoundingBox::IsNotEmpty(Xtight_bbox);
    local_2cc = 1;
    if (!bVar6) goto LAB_003fb761;
  }
  local_2b8 = Xtight_bbox;
  if (xform == (ON_Xform *)0x0) {
    xform_00 = (ON_Xform *)0x0;
  }
  else {
    bVar6 = ON_Xform::IsIdentity(xform,0.0);
    xform_00 = (ON_Xform *)0x0;
    if (!bVar6) {
      xform_00 = xform;
    }
  }
  pOVar15 = local_2b8;
  if ((xform_00 == (ON_Xform *)0x0) && (Clip->m_count < 1)) {
    pdVar10 = ON_3dPoint::operator_cast_to_double_(&local_2b8->m_min);
    pdVar11 = ON_3dPoint::operator_cast_to_double_(&pOVar15->m_max);
    UNRECOVERED_JUMPTABLE = (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19];
    iVar7 = (*UNRECOVERED_JUMPTABLE)(this,pdVar10,pdVar11,(ulong)local_2cc,UNRECOVERED_JUMPTABLE);
    return SUB41(iVar7,0);
  }
  ON_SHA1::ON_SHA1(&sha1);
  if (xform_00 != (ON_Xform *)0x0) {
    ON_SHA1::AccumulateTransformation(&sha1,xform_00);
  }
  lVar16 = 0;
  for (uVar19 = 0; uVar19 < (uint)Clip->m_count; uVar19 = uVar19 + 1) {
    ON_SHA1::AccumulateDoubleArray(&sha1,4,(double *)((long)&Clip->m_a->x + lVar16));
    lVar16 = lVar16 + 0x20;
  }
  ON_SHA1::Hash(&hash,&sha1);
  ON_BoundingBox::ON_BoundingBox(&bbox);
  this_00 = &this->m_tight_bbox_cache;
  bVar6 = ON_BoundingBoxCache::GetBoundingBox(this_00,&hash,&bbox);
  if (bVar6) {
    if (local_2cc == 0) {
LAB_003fb9d9:
      (local_2b8->m_max).y = bbox.m_max.y;
      (local_2b8->m_max).z = bbox.m_max.z;
      (local_2b8->m_min).z = bbox.m_min.z;
      (local_2b8->m_max).x = bbox.m_max.x;
      (local_2b8->m_min).x = bbox.m_min.x;
      (local_2b8->m_min).y = bbox.m_min.y;
      pOVar15 = local_2b8;
    }
    else {
LAB_003fb8b6:
      pOVar15 = local_2b8;
      ON_BoundingBox::Union(local_2b8,&bbox);
    }
    bVar6 = ON_BoundingBox::IsNotEmpty(pOVar15);
  }
  else {
    if (xform_00 == (ON_Xform *)0x0) {
      bVar6 = ON_BoundingBox::IsNotEmpty(&this->m_vertex_bbox);
      if (bVar6) {
        ON_BoundingBox::GetCorners(&this->m_vertex_bbox,(ON_3dPoint *)&ClipData);
        bVar6 = true;
        for (uVar19 = 0; (bVar6 && (uVar19 < 8)); uVar19 = uVar19 + 1) {
          lVar16 = uVar19 * 0x18;
          lVar17 = 0;
          for (lVar20 = 0; (bVar6 && (lVar20 < Clip->m_count)); lVar20 = lVar20 + 1) {
            P_00.y = (double)*(undefined8 *)
                              ((long)&ClipData.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start + lVar16 + 8);
            P_00.x = (double)*(undefined8 *)
                              ((long)&ClipData.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start + lVar16);
            P_00.z = *(double *)
                      ((long)&ClipData.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish + lVar16);
            dVar23 = ON_PlaneEquation::ValueAt
                               ((ON_PlaneEquation *)((long)&Clip->m_a->x + lVar17),P_00);
            bVar6 = dVar23 <= 0.0;
            lVar17 = lVar17 + 0x20;
          }
        }
        if (bVar6) {
          pdVar10 = ON_3dPoint::operator_cast_to_double_(&bbox.m_min);
          pdVar11 = ON_3dPoint::operator_cast_to_double_(&bbox.m_max);
          iVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19])
                            (this,pdVar10,pdVar11,0);
          ON_BoundingBoxCache::AddBoundingBox(this_00,&bbox,&hash);
          if ((local_2cc & (byte)iVar7) != 1) goto LAB_003fb9d9;
          goto LAB_003fb8b6;
        }
      }
    }
    uVar8 = VertexCount(this);
    if ((int)uVar8 < 3) {
      bVar6 = false;
    }
    else {
      uVar1 = Clip->m_count;
      uVar19 = 0x20;
      if ((int)uVar1 < 0x20) {
        uVar19 = (ulong)uVar1;
      }
      n = (uint)uVar19;
      if ((int)uVar1 < 1) {
        iVar7 = 1;
      }
      else {
        __x = std::log2<int>((1 < (int)uVar1) + n);
        dVar23 = ceil(__x);
        iVar7 = 1 << ((byte)(int)dVar23 & 0x1f);
      }
      P.x = (double)((ulong)P.x & 0xffffffffffffff00);
      std::vector<bool,_std::allocator<bool>_>::vector
                (&ClipData,(long)(int)(iVar7 * uVar8),(bool *)&P,(allocator_type *)&Next);
      lVar16 = (long)iVar7;
      local_2c4 = 2;
      for (uVar13 = 0; uVar13 != uVar8; uVar13 = uVar13 + 1) {
        ON_3dPoint::ON_3dPoint(&P,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + uVar13);
        if (xform_00 != (ON_Xform *)0x0) {
          ON_Xform::operator*(&Next,xform_00,&P);
          P.z = Next.z;
          P.x = Next.x;
          P.y = Next.y;
        }
        if ((int)uVar1 < 1) {
LAB_003fbc68:
          ON_BoundingBox::Set(&bbox,&P,1);
        }
        else {
          P_01.y = P.y;
          P_01.x = P.x;
          P_01.z = P.z;
          dVar23 = ON_PlaneEquation::ValueAt(Clip->m_a,P_01);
          __n = uVar13 * lVar16;
          bVar6 = 0.0 < dVar23;
          if (1 < (int)uVar1) {
            local_2b0 = __n;
            rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[](&ClipData,__n + 1);
            puVar12 = rVar25._M_p;
            if (dVar23 <= 0.0) {
              uVar14 = ~rVar25._M_mask & *puVar12;
            }
            else {
              uVar14 = rVar25._M_mask | *puVar12;
            }
            *puVar12 = uVar14;
            lVar17 = 0x20;
            for (lVar20 = 1; __n = local_2b0, lVar20 < (int)n; lVar20 = lVar20 + 1) {
              P_02.y = P.y;
              P_02.x = P.x;
              P_02.z = P.z;
              dVar23 = ON_PlaneEquation::ValueAt
                                 ((ON_PlaneEquation *)((long)&Clip->m_a->x + lVar17),P_02);
              rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&ClipData,(lVar20 + local_2c4) - 1);
              puVar12 = rVar25._M_p;
              if (dVar23 <= 0.0) {
                uVar14 = ~rVar25._M_mask & *puVar12;
              }
              else {
                uVar14 = rVar25._M_mask | *puVar12;
              }
              *puVar12 = uVar14;
              bVar6 = (bool)(bVar6 | 0.0 < dVar23);
              lVar17 = lVar17 + 0x20;
            }
          }
          rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[](&ClipData,__n);
          puVar12 = rVar25._M_p;
          if (!bVar6) {
            *puVar12 = *puVar12 & ~rVar25._M_mask;
            goto LAB_003fbc68;
          }
          *puVar12 = *puVar12 | rVar25._M_mask;
        }
        local_2c4 = local_2c4 + iVar7;
      }
      if (0 < (int)uVar1) {
        for (lVar17 = 0; iVar9 = FaceCount(this), lVar17 < iVar9; lVar17 = lVar17 + 1) {
          pOVar18 = (this->m_F).m_a;
          LastData = 0;
          rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&ClipData,pOVar18[lVar17].vi[0] * lVar16);
          pOVar18 = pOVar18 + lVar17;
          bVar6 = (*rVar25._M_p & rVar25._M_mask) != 0;
          if (bVar6) {
            GetClipData(pOVar18->vi[0],&ClipData,&LastData,n,iVar7);
          }
          local_278 = (ulong)bVar6;
          lVar20 = 0;
LAB_003fbd36:
          lVar21 = lVar20;
          if (lVar21 == 2) goto code_r0x003fbd3f;
          if (lVar21 != 4) goto LAB_003fbd5a;
        }
      }
      ON_BoundingBoxCache::AddBoundingBox(this_00,&bbox,&hash);
      pOVar15 = local_2b8;
      bVar6 = ON_BoundingBox::IsNotEmpty(&bbox);
      if (bVar6) {
        if (local_2cc == 0) {
          (pOVar15->m_max).y = bbox.m_max.y;
          (pOVar15->m_max).z = bbox.m_max.z;
          (pOVar15->m_min).z = bbox.m_min.z;
          (pOVar15->m_max).x = bbox.m_max.x;
          (pOVar15->m_min).x = bbox.m_min.x;
          (pOVar15->m_min).y = bbox.m_min.y;
        }
        else {
          ON_BoundingBox::Union(pOVar15,&bbox);
        }
      }
      bVar6 = ON_BoundingBox::IsNotEmpty(pOVar15);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&ClipData.super__Bvector_base<std::allocator<bool>_>);
    }
  }
  return bVar6;
code_r0x003fbd3f:
  lVar20 = 3;
  if (pOVar18->vi[2] == pOVar18->vi[3]) goto LAB_003fbd36;
LAB_003fbd5a:
  NextData = 0;
  uVar8 = (uint)(lVar21 + 1) & 3;
  rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     (&ClipData,pOVar18->vi[uVar8] * lVar16);
  puVar12 = rVar25._M_p;
  bVar22 = (*puVar12 & rVar25._M_mask) == 0;
  if (bVar22) {
    local_2b0 = (ulong)local_2b0._4_4_ << 0x20;
    uVar1 = 0;
    if (!bVar6) goto LAB_003fc1f7;
  }
  else {
    local_2b0 = CONCAT44(local_2b0._4_4_,(int)CONCAT71(rVar25._M_p._1_7_,1));
    GetClipData(pOVar18->vi[uVar8],&ClipData,&NextData,n,iVar7);
    puVar12 = (ulong *)((ulong)extraout_var << 8);
  }
  if ((local_278 & 1) == 0) {
    GetClipData(pOVar18->vi[lVar21],&ClipData,&LastData,n,iVar7);
    puVar12 = (ulong *)((ulong)extraout_var_00 << 8);
  }
  if ((char)local_2b0 == '\0') {
    local_2b0 = CONCAT44(local_2b0._4_4_,(int)CONCAT71((int7)((ulong)puVar12 >> 8),1));
    GetClipData(pOVar18->vi[lVar21],&ClipData,&NextData,n,iVar7);
  }
  uVar1 = NextData;
  uVar5 = LastData;
  if ((NextData & LastData) == 0) {
    ON_3dPoint::ON_3dPoint
              (&P,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + pOVar18->vi[lVar21]);
    ON_3dPoint::ON_3dPoint
              (&Next,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + pOVar18->vi[uVar8]);
    if (xform_00 != (ON_Xform *)0x0) {
      ON_Xform::operator*((ON_3dPoint *)&D,xform_00,&P);
      P.z = local_208;
      P.x = D.m_t[0];
      P.y = D.m_t[1];
      ON_Xform::operator*((ON_3dPoint *)&D,xform_00,&Next);
      Next.z = local_208;
      Next.x = D.m_t[0];
      Next.y = D.m_t[1];
    }
    ON_Interval::ON_Interval(&Dom,0.0,1.0);
    lVar20 = 0;
    uVar8 = n;
    while ((uVar8 = uVar8 - 1, uVar19 << 5 != lVar20 &&
           (bVar6 = ON_Interval::operator!=(&Dom,&ON_Interval::EmptyInterval), bVar6))) {
      if ((uVar5 >> (uVar8 & 0x1f) & 1) == 0) {
        if ((uVar1 & 1 << ((byte)uVar8 & 0x1f)) != 0) {
          P_05.y = P.y;
          P_05.x = P.x;
          P_05.z = P.z;
          dVar23 = ON_PlaneEquation::ValueAt
                             ((ON_PlaneEquation *)((long)&Clip->m_a->x + lVar20),P_05);
          P_06.y = Next.y;
          P_06.x = Next.x;
          P_06.z = Next.z;
          dVar24 = ON_PlaneEquation::ValueAt
                             ((ON_PlaneEquation *)((long)&Clip->m_a->x + lVar20),P_06);
          ON_Interval::ON_Interval(&D,0.0,-dVar23 / (dVar24 - dVar23));
          ON_Interval::Intersection(&Dom,&D);
        }
      }
      else {
        P_03.y = P.y;
        P_03.x = P.x;
        P_03.z = P.z;
        dVar23 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)((long)&Clip->m_a->x + lVar20),P_03);
        P_04.y = Next.y;
        P_04.x = Next.x;
        P_04.z = Next.z;
        dVar24 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)((long)&Clip->m_a->x + lVar20),P_04);
        ON_Interval::ON_Interval(&D,dVar23 / (dVar23 - dVar24),1.0);
        ON_Interval::Intersection(&Dom,&D);
      }
      lVar20 = lVar20 + 0x20;
    }
    bVar6 = ON_Interval::operator!=(&Dom,&ON_Interval::EmptyInterval);
    if (bVar6) {
      pdVar10 = ON_Interval::operator[](&Dom,0);
      if (0.0 < *pdVar10) {
        pdVar10 = ON_Interval::operator[](&Dom,0);
        ::operator*(&local_1a8,1.0 - *pdVar10,&P);
        pdVar10 = ON_Interval::operator[](&Dom,0);
        ::operator*(&local_1c0,*pdVar10,&Next);
        ON_3dPoint::operator+((ON_3dPoint *)&D,&local_1a8,&local_1c0);
        ON_BoundingBox::Set(&bbox,(ON_3dPoint *)&D,1);
      }
      pdVar10 = ON_Interval::operator[](&Dom,1);
      if (*pdVar10 <= 1.0 && *pdVar10 != 1.0) {
        pdVar10 = ON_Interval::operator[](&Dom,1);
        ::operator*(&local_1a8,1.0 - *pdVar10,&P);
        pdVar10 = ON_Interval::operator[](&Dom,1);
        ::operator*(&local_1c0,*pdVar10,&Next);
        ON_3dPoint::operator+((ON_3dPoint *)&D,&local_1a8,&local_1c0);
        ON_BoundingBox::Set(&bbox,(ON_3dPoint *)&D,1);
      }
    }
  }
LAB_003fc1f7:
  LastData = uVar1;
  local_278 = local_2b0 & 0xffffffff;
  lVar20 = lVar21 + 1;
  bVar6 = !bVar22;
  goto LAB_003fbd36;
}

Assistant:

bool ON_Mesh::GetTightBoundingBox(
	ON_BoundingBox& Xtight_bbox,
	bool bGrowBox,
	const ON_SimpleArray<ON_PlaneEquation>& Clip,
	const ON_Xform* xform
) const
{
	if (bGrowBox && false == Xtight_bbox.IsNotEmpty() )
		bGrowBox = false;

	if (!bGrowBox)
		Xtight_bbox = ON_BoundingBox::EmptyBoundingBox;

	// Avoid applying the identity transformation repeatedly
	if (xform && xform->IsIdentity())
		xform = nullptr;

  if (Clip.Count() <= 0 && xform == nullptr)
    return (GetBBox(Xtight_bbox.m_min, Xtight_bbox.m_max, bGrowBox) ? true : false);

  // Dale Lear
  // Set hash = sha1 hash of information needed to get the tight bounding box.
  // This does not include a hash of mesh vertex locations. These cached
  // boxes are removed by ON_Mesh.InvalidateBoundingBoxes() so this hash
  // does not need to include vertex locations or face information.
  ON_SHA1 sha1;
  if (nullptr != xform)
    sha1.AccumulateTransformation(*xform);
  for (unsigned int i = 0; i < Clip.UnsignedCount(); i++)
  {
    sha1.AccumulateDoubleArray(4, &Clip[i].x);
  }
  const ON_SHA1_Hash hash = sha1.Hash();

  ON_BoundingBox bbox;

  if (m_tight_bbox_cache.GetBoundingBox(hash, bbox))
  {
    if (bGrowBox)
      Xtight_bbox.Union(bbox);
    else
      Xtight_bbox = bbox;
    return Xtight_bbox.IsNotEmpty();
  }

	// Perform clip test on cached bbox 
	if (xform == nullptr && m_vertex_bbox.IsNotEmpty())
	{
		ON_3dPoint Corner[8];
		m_vertex_bbox.GetCorners(Corner);

		bool AllIn = true;
		for( int i=0; AllIn && i<8; i++)
			for (int j = 0; AllIn && j < Clip.Count(); j++)
			{
				AllIn = (Clip[j].ValueAt(Corner[i]) <= 0.0);
			}

    if (AllIn)
    {
      bool rc = GetBBox(bbox.m_min, bbox.m_max, false) ? true : false;
      m_tight_bbox_cache.AddBoundingBox(bbox, hash);
      if (rc && bGrowBox)
        Xtight_bbox.Union(bbox);
      else
        Xtight_bbox = bbox;
      return Xtight_bbox.IsNotEmpty();
    }
	}

	// Now just add verticies of the clipped mesh
	int vcnt = VertexCount();

  // 16 Sept 2021, Mikko, RH-49510:
  // Bail out if the mesh is bogus. In the associated youtrack item
  // this fixes the bounding box of a block being way too big.
  if (vcnt < 3)
    return false;
	
	// n = number of clipping planes.  At most 32 clipping planes are allowed so that this function can use unsigned int
	// to represent the 32 clip predicates.
	int n = Clip.Count();
	if (n > 32)
		n = 32;
	int bits = (n > 1) ? n + 1 : n;
	int bpv = (n>0)?1<<int(ceil(log2(bits))) : 1;		// bits per vertex this is a power of 2
	std::vector<bool> ClipData(vcnt*bpv, false);  // ClipData[ vi*bpv ] is true if vertex vi is clipped out of the view
                                         // If n>1 then further information is provided by
																				//    ClipData[vi*bpv + j+ 1] is true if Clip[j](m_V[vi])>0 that is
																				//           vertex vi is clipped out by Clip[j]
	// Compute ClipData for each vertex
	for (int vi = 0; vi < vcnt; vi++)
	{
		ON_3dPoint P = m_V[vi];
		if (xform)
			P = (*xform)*P;

		bool clipped = false;
		if (n > 0)
		{
			int cdi0 = vi*bpv;
			clipped = Clip[0].ValueAt(P) > 0;

			if (n > 1)
			{
				int cdi1 = cdi0 + 1;
				ClipData[cdi1++] = clipped;
				for (int j = 1; j < n; j++)
				{
					bool out = Clip[j].ValueAt(P) > 0;
					ClipData[cdi1++] = out;
					clipped = clipped || out;
				}
			}
			ClipData[cdi0] = clipped;
		}
		// If the vertex is not clipped add it to the boundingbox
		if( !clipped)
			bbox.Set(P, true);
	}

	if (n > 0)
	{
		// Now process each mesh face and look for intersections with the clipping region boundary
		for (int fi = 0; fi < FaceCount(); fi++)
		{
			const ON_MeshFace& F = m_F[fi];
			unsigned int LastData=0;
			bool LastDataValid = false;
			bool LastOut = ClipData[F.vi[0] * bpv];
			if (LastOut)
			{
				GetClipData(F.vi[0], ClipData, &LastData, n, bpv);
				LastDataValid = true;
			}
			for (int fvi = 0; fvi < 4; fvi++)
			{
				if (fvi == 2 && F.vi[fvi] == F.vi[fvi + 1])
					continue;

				unsigned int NextData=0;
				bool NextDataValid=false;
				bool NextOut = ClipData[F.vi[(fvi + 1) % 4] * bpv];
				if (NextOut)
				{
					GetClipData(F.vi[(fvi + 1) % 4], ClipData, &NextData, n, bpv);
					NextDataValid = true;
				}

				if (LastOut || NextOut)
				{
					// Make sure *Data is Valid
					if (!LastDataValid)
					{
						GetClipData(F.vi[fvi], ClipData, &LastData, n, bpv);
						LastDataValid = true;
					}
					if (!NextDataValid)
					{
						GetClipData(F.vi[fvi], ClipData, &NextData, n, bpv);
						NextDataValid = true;
					}
				}
				if ((LastOut || NextOut) && (LastData & NextData) == 0)
				{
					// Is there a segment of this edge that is not clipped out
					ON_3dPoint Last = m_V[F.vi[fvi]];
					ON_3dPoint Next = m_V[F.vi[(fvi + 1) % 4]];
					if (xform)
					{
						Last = (*xform)*Last;
						Next = (*xform)*Next;
					}

					ON_Interval Dom(0.0, 1.0);  // Dom parameterizes the line segment from Last to Next
					for (int j = 0; j < n && Dom != ON_Interval::EmptyInterval; j++)
					{
						unsigned int mask = 1 << (n - 1 - j);
						if (mask & LastData)
						{
							double cplast = Clip[j].ValueAt(Last);		// out >0
							double cpnext = Clip[j].ValueAt(Next);		// in <0 
							ON_Interval D(cplast / (cplast - cpnext), 1.0);
							Dom.Intersection(D);
						}
						else if (mask & NextData)
						{
							double cplast = Clip[j].ValueAt(Last);
							double cpnext = Clip[j].ValueAt(Next);
							ON_Interval D(0.0, -cplast / (cpnext - cplast));
							Dom.Intersection(D);
						}
					}
					if (Dom != ON_Interval::EmptyInterval)
					{
						if (Dom[0] > 0.0)
						{
							ON_3dPoint Pt = (1 - Dom[0])*Last + Dom[0] * Next;
							bbox.Set(Pt, true);
						}
						if (Dom[1] < 1.0)
						{
							ON_3dPoint Pt = (1 - Dom[1])*Last + Dom[1] * Next;
							bbox.Set(Pt, true);
						}
					}
				}

				LastOut = NextOut;
				LastDataValid = NextDataValid;
				LastData = NextData;
			}
		}
	}

  m_tight_bbox_cache.AddBoundingBox(bbox, hash);
  if (bbox.IsNotEmpty())
  {
    if (bGrowBox)
      Xtight_bbox.Union(bbox);
    else
      Xtight_bbox = bbox;
  }

  return Xtight_bbox.IsNotEmpty();
}